

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O2

bool __thiscall
Metal::Scatter(Metal *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,Ray *ray_out)

{
  undefined8 uVar1;
  Texture *pTVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec3 _reflected;
  Vec3 local_60;
  Vec3 local_54 [2];
  Vec3 local_3c;
  
  uVar1 = *(undefined8 *)(ray_in->m_direction).e;
  local_60.e[0] = (float)uVar1;
  local_60.e[1] = (float)((ulong)uVar1 >> 0x20);
  local_60.e[2] = (ray_in->m_direction).e[2];
  reflect(local_54,&local_60);
  fVar5 = this->m_fuzz;
  random_in_unit_disk();
  operator*(fVar5,&local_3c);
  operator+(local_54,&local_3c);
  fVar5 = ray_in->m_time;
  fVar3 = (hit_record->m_point).e[1];
  fVar4 = (hit_record->m_point).e[2];
  (ray_out->m_origin).e[0] = (hit_record->m_point).e[0];
  (ray_out->m_origin).e[1] = fVar3;
  (ray_out->m_origin).e[2] = fVar4;
  (ray_out->m_direction).e[0] = local_60.e[0];
  *(ulong *)((ray_out->m_direction).e + 1) = CONCAT44(local_60.e[2],local_60.e[1]);
  ray_out->m_time = fVar5;
  pTVar2 = (this->super_Material).m_albedo;
  (*pTVar2->_vptr_Texture[2])((ulong)(uint)hit_record->m_u,&local_60,pTVar2,&hit_record->m_point);
  attenuation->e[2] = local_60.e[2];
  *(ulong *)attenuation->e = CONCAT44(local_60.e[1],local_60.e[0]);
  fVar5 = dot(local_54,&hit_record->m_normal);
  return 0.0 < fVar5;
}

Assistant:

bool
Metal::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _reflected = reflect(ray_in.GetDirection(), hit_record.m_normal);
    ray_out         = Ray(hit_record.m_point, _reflected + m_fuzz*random_in_unit_disk(), ray_in.GetTime());
    attenuation     = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);

    return (dot(_reflected, hit_record.m_normal) > 0.0f);
}